

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::SubRoutineLocLinkLocationReused1::~SubRoutineLocLinkLocationReused1
          (SubRoutineLocLinkLocationReused1 *this)

{
  deqp::SubcaseBase::~SubcaseBase((SubcaseBase *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual long Run()
	{
		//layout(location = 1) subroutine uniform st0 u0;
		//layout(location = 1) subroutine uniform st0 u0;
		SubroutineFunctionSet		   functions_st0(uniformValueGenerator, 2);
		std::vector<SubroutineUniform> subroutineUniforms;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(2), 0, DefOccurence::FSH_OR_CSH));
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(2), 0, DefOccurence::FSH_OR_CSH));
		return doRunNegativeLink(subroutineUniforms);
	}